

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O0

QModelIndex * __thiscall QFileSystemModel::parent(QFileSystemModel *this,QModelIndex *index)

{
  bool bVar1;
  int iVar2;
  QFileSystemModelPrivate *this_00;
  QFileSystemNode *pQVar3;
  QModelIndex *in_RDI;
  int visualRow;
  QFileSystemNode *grandParentNode;
  QFileSystemNode *parentNode;
  QFileSystemNode *indexNode;
  QFileSystemModelPrivate *d;
  QFileSystemModelPrivate *childName;
  QModelIndex *in_stack_ffffffffffffffa0;
  QFileSystemModelPrivate *in_stack_ffffffffffffffa8;
  QFileSystemModelPrivate *this_01;
  QModelIndex *this_02;
  
  this_02 = in_RDI;
  this_00 = d_func((QFileSystemModel *)0xaa4c0b);
  bVar1 = QAbstractItemModelPrivate::indexValid
                    ((QAbstractItemModelPrivate *)this_02,(QModelIndex *)in_stack_ffffffffffffffa8);
  if (bVar1) {
    pQVar3 = QFileSystemModelPrivate::node(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    pQVar3 = pQVar3->parent;
    if ((pQVar3 == (QFileSystemNode *)0x0) || (pQVar3 == &this_00->root)) {
      QModelIndex::QModelIndex((QModelIndex *)0xaa4c7c);
    }
    else {
      childName = (QFileSystemModelPrivate *)pQVar3->parent;
      this_01 = childName;
      QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*>::value
                ((QHash<QString,_QFileSystemModelPrivate::QFileSystemNode_*> *)childName,
                 (QString *)this_00);
      QFileSystemModelPrivate::QFileSystemNode::visibleLocation
                ((QFileSystemNode *)this_00,(QString *)childName);
      iVar2 = QFileSystemModelPrivate::translateVisibleLocation
                        (this_01,(QFileSystemNode *)this_00,(int)((ulong)childName >> 0x20));
      if (iVar2 == -1) {
        QModelIndex::QModelIndex((QModelIndex *)0xaa4cf1);
      }
      else {
        QAbstractItemModel::createIndex
                  ((QAbstractItemModel *)this_02,(int)((ulong)this_01 >> 0x20),(int)this_01,this_00)
        ;
      }
    }
  }
  else {
    QModelIndex::QModelIndex((QModelIndex *)0xaa4c2d);
  }
  return in_RDI;
}

Assistant:

QModelIndex QFileSystemModel::parent(const QModelIndex &index) const
{
    Q_D(const QFileSystemModel);
    if (!d->indexValid(index))
        return QModelIndex();

    QFileSystemModelPrivate::QFileSystemNode *indexNode = d->node(index);
    Q_ASSERT(indexNode != nullptr);
    QFileSystemModelPrivate::QFileSystemNode *parentNode = indexNode->parent;
    if (parentNode == nullptr || parentNode == &d->root)
        return QModelIndex();

    // get the parent's row
    QFileSystemModelPrivate::QFileSystemNode *grandParentNode = parentNode->parent;
    Q_ASSERT(grandParentNode->children.contains(parentNode->fileName));
    int visualRow = d->translateVisibleLocation(grandParentNode, grandParentNode->visibleLocation(grandParentNode->children.value(parentNode->fileName)->fileName));
    if (visualRow == -1)
        return QModelIndex();
    return createIndex(visualRow, 0, parentNode);
}